

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsRbTree.h
# Opt level: O1

void __thiscall
highs::RbTree<HighsNodeQueue::SuboptimalNodeRbTree>::insertFixup
          (RbTree<HighsNodeQueue::SuboptimalNodeRbTree> *this,LinkType z)

{
  ulong *puVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  long x;
  long lVar6;
  long lVar7;
  long x_00;
  ulong uVar8;
  
  uVar4 = *(ulong *)(this[2].rootNode[1] + 0x70 + z * 0x90);
  while ((uVar4 = uVar4 & 0x7fffffffffffffff, uVar4 != 0 &&
         (*(long *)(uVar4 * 0x90 + -0x20 + this[2].rootNode[1]) < 0))) {
    x_00 = uVar4 - 1;
    lVar2 = this[2].rootNode[1];
    lVar5 = x_00 * 0x90;
    uVar4 = *(ulong *)(lVar2 + 0x70 + lVar5) & 0x7fffffffffffffff;
    lVar6 = uVar4 - 1;
    lVar3 = *(long *)(uVar4 * 0x90 + -0x30 + lVar2);
    uVar8 = (ulong)(lVar3 == x_00);
    lVar7 = *(long *)(uVar4 * 0x90 + lVar2 + -0x30 + uVar8 * 8);
    if ((lVar7 == -1) || (lVar7 = lVar7 * 0x90, -1 < *(long *)(lVar2 + 0x70 + lVar7))) {
      lVar7 = x_00;
      x = lVar6;
      lVar6 = z;
      if (z == *(long *)(lVar2 + lVar5 + 0x60 + uVar8 * 8)) {
        rotate(this,x_00,(uint)(lVar3 != x_00));
        uVar4 = *(ulong *)(this[2].rootNode[1] + 0x70 + lVar5) & 0x7fffffffffffffff;
        lVar7 = uVar4 - 1;
        x = (*(ulong *)(uVar4 * 0x90 + -0x20 + this[2].rootNode[1]) & 0x7fffffffffffffff) - 1;
        lVar6 = x_00;
      }
      lVar2 = this[2].rootNode[1];
      puVar1 = (ulong *)(lVar2 + 0x70 + lVar7 * 0x90);
      *puVar1 = *puVar1 & 0x7fffffffffffffff;
      puVar1 = (ulong *)(lVar2 + 0x70 + x * 0x90);
      *puVar1 = *puVar1 | 0x8000000000000000;
      rotate(this,x,(uint)(lVar3 == x_00));
    }
    else {
      *(ulong *)(lVar2 + lVar5 + 0x70) = uVar4;
      puVar1 = (ulong *)(lVar2 + 0x70 + lVar7);
      *puVar1 = *puVar1 & 0x7fffffffffffffff;
      puVar1 = (ulong *)(lVar2 + 0x70 + lVar6 * 0x90);
      *puVar1 = *puVar1 | 0x8000000000000000;
    }
    uVar4 = *(ulong *)(this[2].rootNode[1] + 0x70 + lVar6 * 0x90);
    z = lVar6;
  }
  puVar1 = (ulong *)(this[2].rootNode[1] + 0x70 + *this->rootNode * 0x90);
  *puVar1 = *puVar1 & 0x7fffffffffffffff;
  return;
}

Assistant:

void insertFixup(LinkType z) {
    LinkType pZ = getParent(z);
    while (isRed(pZ)) {
      LinkType zGrandParent = getParent(pZ);
      assert(zGrandParent != kNoLink);

      Dir dir = Dir(getChild(zGrandParent, kLeft) == pZ);

      LinkType y = getChild(zGrandParent, dir);
      if (isRed(y)) {
        makeBlack(pZ);
        makeBlack(y);
        makeRed(zGrandParent);
        z = zGrandParent;
      } else {
        if (z == getChild(pZ, dir)) {
          z = pZ;
          rotate(z, opposite(dir));
          pZ = getParent(z);
          zGrandParent = getParent(pZ);
          assert(zGrandParent != kNoLink);
        }

        makeBlack(pZ);
        makeRed(zGrandParent);
        rotate(zGrandParent, dir);
      }

      pZ = getParent(z);
    }

    makeBlack(rootNode);
  }